

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O2

void __thiscall UnifiedRegex::RegexPattern::Finalize(RegexPattern *this,bool isShutdown)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  RegexPatternMruMap *this_00;
  undefined4 *puVar5;
  undefined7 in_register_00000031;
  int local_58;
  byte local_54;
  InternalString source;
  RegexPattern *local_38;
  RegexPattern *p;
  
  if (((int)CONCAT71(in_register_00000031,isShutdown) == 0) &&
     (pSVar1 = (((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
     pSVar1 != (ScriptContext *)0x0)) {
    if ((this->field_0x18 & 1) == 0) {
      iVar4 = (*(pSVar1->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar1);
      if ((((char)iVar4 == '\0') && (pSVar1->threadContext->isThreadBound == true)) &&
         ((((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
          chakraEngine.ptr == (ChakraEngine *)0x0)) {
        GetSource((RegexPattern *)&local_58);
        local_38 = (RegexPattern *)0x0;
        this_00 = Js::ScriptContext::GetDynamicRegexMap
                            ((((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
        ;
        RegexKey::RegexKey((RegexKey *)&source.m_content,
                           (char16 *)((ulong)((uint)local_54 * 2) + source._0_8_),local_58,
                           ((this->rep).unified.program.ptr)->flags);
        bVar3 = JsUtil::
                MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
                ::TryGetValue(this_00,(RegexKey *)&source.m_content,&local_38);
        if (((local_58 != 0) && (bVar3)) && (local_38 == this)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                             ,0x37,
                             "(!hasRegexPatternForSourceKey || isSourceLengthZero || isUniquePattern)"
                             ,
                             "!hasRegexPatternForSourceKey || isSourceLengthZero || isUniquePattern"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
      }
    }
    if ((this->field_0x18 & 2) == 0) {
      Program::FreeBody((this->rep).unified.program.ptr,&pSVar1->regexAllocator);
    }
  }
  return;
}

Assistant:

void RegexPattern::Finalize(bool isShutdown)
    {
        if (isShutdown)
        {
            return;
        }

        const auto scriptContext = GetScriptContext();
        if (!scriptContext)
        {
            return;
        }

#if DBG
        // In JSRT or ChakraEngine, we might not have a chance to close at finalize time
        if (!isLiteral && !scriptContext->IsClosed() &&
            !scriptContext->GetThreadContext()->IsJSRT() &&
            !scriptContext->GetLibrary()->IsChakraEngine())
        {
            const auto source = GetSource();
            RegexPattern *p = nullptr;

            bool hasRegexPatternForSourceKey = GetScriptContext()->GetDynamicRegexMap()->TryGetValue(
                RegexKey(source.GetBuffer(), source.GetLength(), GetFlags()), &p);
            bool isSourceLengthZero = source.GetLength() == 0;
            bool isUniquePattern = p != this;

            Assert(!hasRegexPatternForSourceKey || isSourceLengthZero || isUniquePattern);
        }
#endif

        if (isShallowClone)
        {
            return;
        }

        rep.unified.program->FreeBody(scriptContext->RegexAllocator());
    }